

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::TSPI_PDU::SetEntityOrientationFlag(TSPI_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  short sVar2;
  
  if ((((this->m_TSPIFlagUnion).m_ui8Flag & 2) == 0) == F) {
    sVar2 = -3;
    if (F) {
      sVar2 = 3;
    }
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xfd | F * '\x02';
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + sVar2;
  }
  return;
}

Assistant:

void TSPI_PDU::SetEntityOrientationFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8Ori )return;

    m_TSPIFlagUnion.m_ui8Ori = F;

    if( F )
    {
        m_ui16PDULength += LE_EulerAngles::LE_EULER_ANGLES_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_EulerAngles::LE_EULER_ANGLES_SIZE;
    }
}